

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

void P_PlayerOnSpecial3DFloor(player_t *player)

{
  F3DFloor *pFVar1;
  bool bVar2;
  int floorType;
  xfloor *this;
  F3DFloor **ppFVar3;
  double dVar4;
  double dVar5;
  F3DFloor *rover;
  iterator __end1;
  iterator __begin1;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range1;
  player_t *player_local;
  
  this = &((player->mo->super_AActor).Sector)->e->XFloor;
  __end1 = TArray<F3DFloor_*,_F3DFloor_*>::begin((TArray<F3DFloor_*,_F3DFloor_*> *)this);
  rover = (F3DFloor *)TArray<F3DFloor_*,_F3DFloor_*>::end((TArray<F3DFloor_*,_F3DFloor_*> *)this);
  do {
    bVar2 = TIterator<F3DFloor_*>::operator!=(&__end1,(TIterator<F3DFloor_*> *)&rover);
    if (!bVar2) {
      return;
    }
    ppFVar3 = TIterator<F3DFloor_*>::operator*(&__end1);
    pFVar1 = *ppFVar3;
    if (((pFVar1->flags & 1) != 0) && ((pFVar1->flags & 0x200000) == 0)) {
      if ((pFVar1->flags & 2) == 0) {
        dVar4 = AActor::Z(&player->mo->super_AActor);
        dVar5 = secplane_t::ZatPoint((pFVar1->top).plane,&player->mo->super_AActor);
        if (dVar4 <= dVar5) {
          dVar4 = AActor::Top(&player->mo->super_AActor);
          dVar5 = secplane_t::ZatPoint((pFVar1->bottom).plane,&player->mo->super_AActor);
          if (dVar5 <= dVar4) goto LAB_00600c86;
        }
      }
      else {
        dVar4 = AActor::Z(&player->mo->super_AActor);
        dVar5 = secplane_t::ZatPoint((pFVar1->top).plane,&player->mo->super_AActor);
        if ((dVar4 == dVar5) && (!NAN(dVar4) && !NAN(dVar5))) {
LAB_00600c86:
          P_PlayerInSpecialSector(player,pFVar1->model);
          floorType = sector_t::GetTerrain(pFVar1->model,(pFVar1->top).isceiling);
          P_PlayerOnSpecialFlat(player,floorType);
          return;
        }
      }
    }
    TIterator<F3DFloor_*>::operator++(&__end1);
  } while( true );
}

Assistant:

void P_PlayerOnSpecial3DFloor(player_t* player)
{
	for(auto rover : player->mo->Sector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_EXISTS)) continue;
		if (rover->flags & FF_FIX) continue;

		// Check the 3D floor's type...
		if(rover->flags & FF_SOLID)
		{
			// Player must be on top of the floor to be affected...
			if(player->mo->Z() != rover->top.plane->ZatPoint(player->mo)) continue;
		}
		else
		{
			//Water and DEATH FOG!!! heh
			if (player->mo->Z() > rover->top.plane->ZatPoint(player->mo) || 
				player->mo->Top() < rover->bottom.plane->ZatPoint(player->mo))
				continue;
		}

		// Apply sector specials
		P_PlayerInSpecialSector(player, rover->model);

		// Apply flat specials (using the ceiling!)
		P_PlayerOnSpecialFlat(
			player, rover->model->GetTerrain(rover->top.isceiling));

		break;
	}
}